

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.hpp
# Opt level: O3

TupleAccess * __thiscall
Pass1::create<TupleAccess,Expression_const*&,unsigned_long_const&,Type_const*&>
          (Pass1 *this,Expression **arguments,unsigned_long *arguments_1,Type **arguments_2)

{
  Expression *pEVar1;
  size_t sVar2;
  Block *pBVar3;
  TupleAccess *pTVar4;
  
  pTVar4 = (TupleAccess *)operator_new(0x30);
  pEVar1 = *arguments;
  sVar2 = *arguments_1;
  (pTVar4->super_Expression).type = *arguments_2;
  (pTVar4->super_Expression).next_expression = (Expression *)0x0;
  (pTVar4->super_Expression)._vptr_Expression = (_func_int **)&PTR__Expression_00153068;
  pTVar4->tuple = pEVar1;
  pTVar4->index = sVar2;
  pBVar3 = this->destination_block;
  if (pBVar3->first == (Expression *)0x0) {
    pBVar3->first = (Expression *)pTVar4;
  }
  if (pBVar3->last != (Expression *)0x0) {
    pBVar3->last->next_expression = (Expression *)pTVar4;
  }
  pBVar3->last = (Expression *)pTVar4;
  return pTVar4;
}

Assistant:

T* create(A&&... arguments) {
		T* expression = new T(std::forward<A>(arguments)...);
		destination_block->add_expression(expression);
		return expression;
	}